

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateEnumCInit
               (EnumDescriptor *desc,Printer *printer)

{
  char *pcVar1;
  size_type in_R9;
  lts_20250127 *this;
  string_view text;
  string_view s;
  FixedMapping replacements;
  string c_name;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  pcVar1 = (desc->all_names_).payload_;
  this = (lts_20250127 *)(ulong)*(ushort *)(pcVar1 + 2);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_48,(char (*) [2])0x1096008,(char (*) [2])0xd6323e);
  s._M_str = (char *)&local_48;
  s._M_len = (size_t)(pcVar1 + ~(ulong)this);
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&c_name,this,s,replacements);
  text._M_str = "  $c_name$_ModuleInit();\n";
  text._M_len = 0x19;
  io::Printer::Print<char[7],std::__cxx11::string>(printer,text,(char (*) [7])0xff9813,&c_name);
  std::__cxx11::string::~string((string *)&c_name);
  return;
}

Assistant:

void GenerateEnumCInit(const EnumDescriptor* desc, io::Printer* printer) {
  std::string c_name = absl::StrReplaceAll(desc->full_name(), {{".", "_"}});

  printer->Print("  $c_name$_ModuleInit();\n", "c_name", c_name);
}